

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void __thiscall DerBase::CheckOutputSize(DerBase *this,size_t cbUsed)

{
  ulong uVar1;
  out_of_range *this_00;
  long lVar2;
  
  uVar1 = this->cbData;
  lVar2 = 2;
  if ((((0x7f < uVar1) && (lVar2 = 3, 0xff < uVar1)) && (lVar2 = 4, 0xffff < uVar1)) &&
     (((lVar2 = 5, 0xffffff < uVar1 && (lVar2 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar2 = 7, uVar1 >> 0x28 != 0)))) {
    lVar2 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  if (lVar2 + uVar1 == cbUsed) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Size mismatch!");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void CheckOutputSize(size_t cbUsed)
    {
        if (1 + GetSizeBytes(cbData) + cbData != cbUsed)
            throw std::out_of_range("Size mismatch!");
    }